

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O3

bb_insn_t_conflict add_new_bb_insn(gen_ctx_t gen_ctx,MIR_insn_t insn,bb_t_conflict bb,int append_p)

{
  long lVar1;
  bitmap_t bm;
  ulong uVar2;
  ulong uVar3;
  bb_insn_t_conflict pbVar4;
  bb_insn_t_conflict extraout_RAX;
  bb_insn_t_conflict extraout_RAX_00;
  undefined1 uVar5;
  bb_insn_t pbVar6;
  long extraout_RDX;
  bb_insn_t *ppbVar7;
  undefined8 *puVar8;
  DLIST_LINK_bb_insn_t *pDVar9;
  uint uVar10;
  ulong *nb;
  gen_ctx_t gen_ctx_00;
  bitmap_t pVVar11;
  int in_R8D;
  MIR_disp_t *pMVar12;
  
  pbVar4 = create_bb_insn(gen_ctx,insn,bb);
  gen_ctx_00 = (gen_ctx_t)&bb->bb_insns;
  if (append_p != 0) {
    DLIST_bb_insn_t_append((DLIST_bb_insn_t *)gen_ctx_00,pbVar4);
    return extraout_RAX;
  }
  pbVar6 = ((DLIST_bb_insn_t *)gen_ctx_00)->head;
  if (pbVar6 == (bb_insn_t)0x0) {
    if ((bb->bb_insns).tail == (bb_insn_t)0x0) {
      pDVar9 = (DLIST_LINK_bb_insn_t *)&(bb->bb_insns).tail;
      goto LAB_0015eede;
    }
  }
  else {
    if ((pbVar6->bb_insn_link).prev == (bb_insn_t)0x0) {
      pDVar9 = &pbVar6->bb_insn_link;
LAB_0015eede:
      pDVar9->prev = pbVar4;
      (pbVar4->bb_insn_link).prev = (bb_insn_t)0x0;
      (pbVar4->bb_insn_link).next = pbVar6;
      ((DLIST_bb_insn_t *)gen_ctx_00)->head = pbVar4;
      return pbVar4;
    }
    add_new_bb_insn_cold_1();
  }
  uVar5 = SUB81(pbVar6,0);
  add_new_bb_insn_cold_2();
  uVar10 = 0x38;
  pbVar4 = (bb_insn_t_conflict)gen_malloc(gen_ctx_00,0x38);
  pbVar4->insn = insn;
  pbVar4->gvn_val_const_p = (char)extraout_RDX;
  pbVar4->alloca_flag = (char)((ulong)extraout_RDX >> 8);
  *(short *)&pbVar4->field_0xa = (short)((ulong)extraout_RDX >> 0x10);
  pbVar4->index = (int)((ulong)extraout_RDX >> 0x20);
  if (in_R8D == 0) {
    lVar1 = *(long *)(extraout_RDX + 0x30);
    if (lVar1 != 0) {
      if (*(long *)(lVar1 + 0x10) != 0) goto LAB_0015f037;
      puVar8 = (undefined8 *)(lVar1 + 0x10);
LAB_0015efcb:
      *puVar8 = pbVar4;
      *(undefined8 *)&pbVar4->mem_index = 0;
      pbVar4->gvn_val = lVar1;
      *(bb_insn_t_conflict *)(extraout_RDX + 0x30) = pbVar4;
      pbVar6 = *(bb_insn_t *)((long)&insn->ops[0].u + 0x10);
      if (pbVar6 == (bb_insn_t)0x0) {
        if (insn->ops[0].u.mem.disp != 0) goto LAB_0015f050;
        pDVar9 = (DLIST_LINK_bb_insn_t *)((long)&insn->ops[0].u + 0x18);
LAB_0015efff:
        pMVar12 = (MIR_disp_t *)((long)&insn->ops[0].u + 0x10);
        pDVar9->prev = pbVar4;
        (pbVar4->bb_insn_link).prev = (bb_insn_t)0x0;
        (pbVar4->bb_insn_link).next = pbVar6;
        goto LAB_0015f012;
      }
      if ((pbVar6->bb_insn_link).prev == (bb_insn_t)0x0) {
        pDVar9 = &pbVar6->bb_insn_link;
        goto LAB_0015efff;
      }
      goto LAB_0015f046;
    }
    if (*(long *)(extraout_RDX + 0x38) == 0) {
      puVar8 = (undefined8 *)(extraout_RDX + 0x38);
      goto LAB_0015efcb;
    }
  }
  else {
    lVar1 = *(long *)(extraout_RDX + 0x38);
    if (lVar1 == 0) {
      if (*(long *)(extraout_RDX + 0x30) == 0) {
        puVar8 = (undefined8 *)(extraout_RDX + 0x30);
        goto LAB_0015ef6b;
      }
LAB_0015f03c:
      create_edge_cold_2();
    }
    else {
      if (*(long *)(lVar1 + 0x18) != 0) {
        create_edge_cold_1();
LAB_0015f032:
        create_edge_cold_3();
LAB_0015f037:
        create_edge_cold_5();
        goto LAB_0015f03c;
      }
      puVar8 = (undefined8 *)(lVar1 + 0x18);
LAB_0015ef6b:
      *puVar8 = pbVar4;
      pbVar4->gvn_val = 0;
      *(long *)&pbVar4->mem_index = lVar1;
      *(bb_insn_t_conflict *)(extraout_RDX + 0x38) = pbVar4;
      pbVar6 = (bb_insn_t)insn->ops[0].u.mem.disp;
      if (pbVar6 != (bb_insn_t)0x0) {
        if ((pbVar6->bb_insn_link).next != (bb_insn_t)0x0) goto LAB_0015f032;
        ppbVar7 = &(pbVar6->bb_insn_link).next;
LAB_0015efa7:
        *ppbVar7 = pbVar4;
        (pbVar4->bb_insn_link).next = (bb_insn_t)0x0;
        pMVar12 = &insn->ops[0].u.mem.disp;
        (pbVar4->bb_insn_link).prev = pbVar6;
LAB_0015f012:
        *pMVar12 = (MIR_disp_t)pbVar4;
        *(undefined1 *)&pbVar4->bb = uVar5;
        *(undefined1 *)((long)&pbVar4->bb + 3) = 0;
        *(undefined2 *)((long)&pbVar4->bb + 1) = 0;
        return pbVar4;
      }
      if (*(long *)((long)&insn->ops[0].u + 0x10) == 0) {
        ppbVar7 = (bb_insn_t *)((long)&insn->ops[0].u + 0x10);
        goto LAB_0015efa7;
      }
    }
    create_edge_cold_4();
LAB_0015f046:
    create_edge_cold_7();
  }
  create_edge_cold_6();
LAB_0015f050:
  create_edge_cold_8();
  if (uVar10 < 0x22) {
    __assert_fail("reg > ST1_HARD_REG",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                  ,0x5f3,"void update_tied_regs(gen_ctx_t, MIR_reg_t)");
  }
  pbVar4 = extraout_RAX_00;
  if (uVar10 != 0xffffffff) {
    pbVar4 = (bb_insn_t_conflict)
             MIR_reg_hard_reg_name
                       (gen_ctx_00->ctx,uVar10 - 0x21,(gen_ctx_00->curr_func_item->u).func);
    if (pbVar4 != (bb_insn_t_conflict)0x0) {
      bm = gen_ctx_00->tied_regs;
      nb = (ulong *)((ulong)uVar10 + 1);
      pVVar11 = bm;
      bitmap_expand(bm,(size_t)nb);
      if (bm == (bitmap_t)0x0) {
        update_tied_regs_cold_1();
        uVar2 = pVVar11->els_num;
        if ((*(int *)(uVar2 + 0x18) == 0xb4) && (uVar3 = *nb, *(int *)(uVar3 + 0x18) == 0xb4)) {
          pbVar4 = (bb_insn_t_conflict)0xffffffff;
          if (uVar3 <= uVar2) {
            pbVar4 = (bb_insn_t_conflict)(ulong)(uVar2 != uVar3);
          }
          return pbVar4;
        }
        __assert_fail("lab1->code == MIR_LABEL && lab2->code == MIR_LABEL",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                      ,0x60c,"int label_cmp(const void *, const void *)");
      }
      pbVar4 = (bb_insn_t_conflict)bm->varr;
      (&pbVar4->insn)[uVar10 >> 6] =
           (MIR_insn_t)((ulong)(&pbVar4->insn)[uVar10 >> 6] | 1L << ((ulong)uVar10 & 0x3f));
    }
  }
  return pbVar4;
}

Assistant:

static bb_insn_t add_new_bb_insn (gen_ctx_t gen_ctx, MIR_insn_t insn, bb_t bb, int append_p) {
  bb_insn_t bb_insn = create_bb_insn (gen_ctx, insn, bb);

  if (append_p)
    DLIST_APPEND (bb_insn_t, bb->bb_insns, bb_insn);
  else
    DLIST_PREPEND (bb_insn_t, bb->bb_insns, bb_insn);
  return bb_insn;
}